

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http.c
# Opt level: O0

int mk_http_request_prepare(mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  mk_list *__mptr_1;
  mk_list *__mptr;
  mk_http_header *header;
  mk_list *alias;
  mk_list *hosts;
  char *temp;
  int status;
  int ret;
  mk_server *server_local;
  mk_http_request *sr_local;
  mk_http_session *cs_local;
  
  pcVar2 = mk_utils_url_decode(sr->uri);
  if (pcVar2 == (char *)0x0) {
    (sr->uri_processed).data = (sr->uri).data;
    (sr->uri_processed).len = (sr->uri).len;
  }
  else {
    (sr->uri_processed).data = pcVar2;
    sVar3 = strlen(pcVar2);
    (sr->uri_processed).len = sVar3;
  }
  sr->host_conf = (mk_vhost *)&(server->hosts).next[-7].next;
  sr->user_home = 0;
  if (*(sr->uri_processed).data == '/') {
    mk_http_point_header(&sr->host,&cs->parser,0xb);
    mk_http_point_header(&sr->connection,&cs->parser,7);
    mk_http_point_header(&sr->range,&cs->parser,0x10);
    mk_http_point_header(&sr->if_modified_since,&cs->parser,0xd);
    if (((sr->host).data == (char *)0x0) && (sr->protocol == 0xb)) {
      mk_http_error(400,cs,sr,server);
      cs_local._4_4_ = 0;
    }
    else {
      mk_http_keepalive_check(cs,sr,server);
      if ((cs->parser).headers[8].type == 8) {
        (sr->_content_length).data = (cs->parser).headers[8].val.data;
        (sr->_content_length).len = (cs->parser).headers[8].val.len;
      }
      else {
        (sr->_content_length).data = (char *)0x0;
      }
      sr->host_alias = (mk_vhost_alias *)((sr->host_conf->server_names).next + -1);
      if ((sr->host).data != (char *)0x0) {
        if (0 < (cs->parser).header_host_port) {
          sr->port = (long)(cs->parser).header_host_port;
        }
        mk_vhost_get(sr->host,&sr->host_conf,&sr->host_alias,server);
        if ((sr->host_conf->header_redirect).data != (char *)0x0) {
          mk_header_set_http_status(sr,0x12d);
          pcVar2 = mk_string_dup((sr->host_conf->header_redirect).data);
          (sr->headers).location = pcVar2;
          (sr->headers).content_length = 0;
          (sr->headers).location = (char *)0x0;
          mk_header_prepare(cs,sr,server);
          return 0;
        }
      }
      if ((((server->conf_user_pub == (char *)0x0) || ((sr->uri_processed).len < 3)) ||
          ((sr->uri_processed).data[1] != '~')) || (iVar1 = mk_user_init(cs,sr,server), iVar1 == 0))
      {
        iVar1 = mk_plugin_stage_run_20(cs,sr,server);
        if (iVar1 == 300) {
          cs_local._4_4_ = -2;
        }
        else {
          cs_local._4_4_ = mk_http_init(cs,sr,server);
        }
      }
      else {
        mk_http_error(0x194,cs,sr,server);
        cs_local._4_4_ = -2;
      }
    }
  }
  else {
    mk_http_error(400,cs,sr,server);
    cs_local._4_4_ = 0;
  }
  return cs_local._4_4_;
}

Assistant:

static int mk_http_request_prepare(struct mk_http_session *cs,
                                   struct mk_http_request *sr,
                                   struct mk_server *server)
{
    int ret;
    int status = 0;
    char *temp;
    struct mk_list *hosts = &server->hosts;
    struct mk_list *alias;
    struct mk_http_header *header;

    /*
     * Process URI, if it contains ASCII encoded strings like '%20',
     * it will return a new memory buffer with the decoded string, otherwise
     * it returns NULL
     */
    temp = mk_utils_url_decode(sr->uri);

    if (temp) {
        sr->uri_processed.data = temp;
        sr->uri_processed.len  = strlen(temp);
    }
    else {
        sr->uri_processed.data = sr->uri.data;
        sr->uri_processed.len  = sr->uri.len;
    }

    /* Always assign the default vhost' */
    sr->host_conf = mk_list_entry_first(hosts, struct mk_vhost, _head);
    sr->user_home = MK_FALSE;

    /* Valid request URI? */
    if (sr->uri_processed.data[0] != '/') {
        mk_http_error(MK_CLIENT_BAD_REQUEST, cs, sr, server);
        return MK_EXIT_OK;
    }

    /* Check if we have a Host header: Hostname ; port */
    mk_http_point_header(&sr->host, &cs->parser, MK_HEADER_HOST);

    /* Header: Connection */
    mk_http_point_header(&sr->connection, &cs->parser, MK_HEADER_CONNECTION);

    /* Header: Range */
    mk_http_point_header(&sr->range, &cs->parser, MK_HEADER_RANGE);

    /* Header: If-Modified-Since */
    mk_http_point_header(&sr->if_modified_since,
                         &cs->parser,
                         MK_HEADER_IF_MODIFIED_SINCE);

    /* HTTP/1.1 needs Host header */
    if (!sr->host.data && sr->protocol == MK_HTTP_PROTOCOL_11) {
        mk_http_error(MK_CLIENT_BAD_REQUEST, cs, sr, server);
        return MK_EXIT_OK;
    }

    /* Should we close the session after this request ? */
    mk_http_keepalive_check(cs, sr, server);

    /* Content Length */
    header = &cs->parser.headers[MK_HEADER_CONTENT_LENGTH];
    if (header->type == MK_HEADER_CONTENT_LENGTH) {
        sr->_content_length.data = header->val.data;
        sr->_content_length.len  = header->val.len;
    }
    else {
        sr->_content_length.data = NULL;
    }

    /* Assign the first node alias */
    alias = &sr->host_conf->server_names;
    sr->host_alias = mk_list_entry_first(alias,
                                         struct mk_vhost_alias, _head);

    if (sr->host.data) {
        /* Set the given port */
        if (cs->parser.header_host_port > 0) {
            sr->port = cs->parser.header_host_port;
        }

        /* Match the virtual host */
        mk_vhost_get(sr->host, &sr->host_conf, &sr->host_alias, server);

        /* Check if this virtual host have some redirection */
        if (sr->host_conf->header_redirect.data) {
            mk_header_set_http_status(sr, MK_REDIR_MOVED);
            sr->headers.location = mk_string_dup(sr->host_conf->header_redirect.data);
            sr->headers.content_length = 0;
            sr->headers.location = NULL;
            mk_header_prepare(cs, sr, server);
            return 0;
        }
    }

    /* Is requesting an user home directory ? */
    if (server->conf_user_pub &&
        sr->uri_processed.len > 2 &&
        sr->uri_processed.data[1] == MK_USER_HOME) {

        if (mk_user_init(cs, sr, server) != 0) {
            mk_http_error(MK_CLIENT_NOT_FOUND, cs, sr, server);
            return MK_EXIT_ABORT;
        }
    }

    /* Plugins Stage 20 */
    ret = mk_plugin_stage_run_20(cs, sr, server);
    if (ret == MK_PLUGIN_RET_CLOSE_CONX) {
        MK_TRACE("STAGE 20 requested close conexion");
        return MK_EXIT_ABORT;
    }

    /* Normal HTTP process */
    status = mk_http_init(cs, sr, server);

    MK_TRACE("[FD %i] HTTP Init returning %i", cs->socket, status);
    return status;
}